

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_f7a406::SeedStrengthen(CSHA512 *hasher,RNGState *rng,duration dur)

{
  long lVar1;
  CSHA512 *in_RSI;
  uchar (*in_RDI) [32];
  long in_FS_OFFSET;
  uchar strengthen_seed [32];
  undefined1 local_f0 [14];
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  CSHA512 *in_stack_ffffffffffffff20;
  duration in_stack_ffffffffffffff28;
  uchar *in_stack_ffffffffffffff30;
  RNGState *in_stack_ffffffffffffff38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_f0,in_RDI,200);
  RNGState::MixExtract
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28.__r,
             in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f,
             (bool)in_stack_ffffffffffffff1e);
  Strengthen(in_RDI,in_stack_ffffffffffffff28,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedStrengthen(CSHA512& hasher, RNGState& rng, SteadyClock::duration dur) noexcept
{
    // Generate 32 bytes of entropy from the RNG, and a copy of the entropy already in hasher.
    // Never use the deterministic PRNG for this, as the result is only used internally.
    unsigned char strengthen_seed[32];
    rng.MixExtract(strengthen_seed, sizeof(strengthen_seed), CSHA512(hasher), false, /*always_use_real_rng=*/true);
    // Strengthen the seed, and feed it into hasher.
    Strengthen(strengthen_seed, dur, hasher);
}